

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quaternion.h
# Opt level: O3

Vector4d * __thiscall
RigidBodyDynamics::Math::Quaternion::omegaToQDot
          (Vector4d *__return_storage_ptr__,Quaternion *this,Vector3d *omega)

{
  Matrix43 m;
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_3,_0,_4,_3>_>,_const_Eigen::Matrix<double,_4,_3,_0,_4,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  aMStack_98 [16];
  undefined8 local_88;
  double *local_80;
  Vector3d *local_70;
  double local_68;
  double local_60;
  undefined4 local_58;
  uint uStack_54;
  undefined4 uStack_50;
  uint uStack_4c;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  local_68 = (this->super_Vector4d).super_Vector4d.
             super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3];
  local_80 = &local_68;
  local_60 = (this->super_Vector4d).super_Vector4d.
             super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2];
  local_48 = -local_60;
  local_28 = (this->super_Vector4d).super_Vector4d.
             super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1];
  local_38 = (this->super_Vector4d).super_Vector4d.
             super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0];
  uStack_50 = SUB84(local_38,0);
  uStack_4c = (uint)((ulong)local_38 >> 0x20) ^ 0x80000000;
  local_20 = -local_38;
  local_58 = SUB84(local_28,0);
  uStack_54 = (uint)((ulong)local_28 >> 0x20) ^ 0x80000000;
  local_30 = -local_28;
  local_10 = -local_60;
  local_88 = 0x3fe0000000000000;
  local_70 = omega;
  local_40 = local_68;
  local_18 = local_68;
  Vector4_t::
  Vector4_t<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,3,0,4,3>const>const,Eigen::Matrix<double,4,3,0,4,3>const>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            (__return_storage_ptr__,aMStack_98);
  return __return_storage_ptr__;
}

Assistant:

Vector4d omegaToQDot(const Vector3d& omega) const {
      Math::Matrix43 m;
      m(0, 0) =  (*this)[3];   m(0, 1) = -(*this)[2];   m(0, 2) =  (*this)[1];
      m(1, 0) =  (*this)[2];   m(1, 1) =  (*this)[3];   m(1, 2) = -(*this)[0];
      m(2, 0) = -(*this)[1];   m(2, 1) =  (*this)[0];   m(2, 2) =  (*this)[3];
      m(3, 0) = -(*this)[0];   m(3, 1) = -(*this)[1];   m(3, 2) = -(*this)[2];
      return Quaternion(0.5 * m * omega);
    }